

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

char * kj::_::fill<kj::String,kj::StringPtr&,kj::StringPtr>
                 (char *target,String *first,StringPtr *rest,StringPtr *rest_1)

{
  char *__src;
  size_t sVar1;
  char *pcVar2;
  
  __src = (first->content).ptr;
  sVar1 = (first->content).size_;
  pcVar2 = __src + (sVar1 - 1);
  if (sVar1 == 0) {
    pcVar2 = (char *)0x0;
    __src = (char *)0x0;
  }
  if (__src != pcVar2) {
    memcpy(target,__src,(long)pcVar2 - (long)__src);
    target = target + ((long)pcVar2 - (long)__src);
  }
  pcVar2 = (rest->content).ptr;
  sVar1 = (rest->content).size_;
  if (pcVar2 != pcVar2 + (sVar1 - 1)) {
    memcpy(target,pcVar2,sVar1 - 1);
    target = target + (sVar1 - 1);
  }
  pcVar2 = (rest_1->content).ptr;
  sVar1 = (rest_1->content).size_;
  if (pcVar2 != pcVar2 + (sVar1 - 1)) {
    memcpy(target,pcVar2,sVar1 - 1);
    target = target + (sVar1 - 1);
  }
  return target;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}